

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O1

void anon_unknown.dwarf_d9e81e::ProcessMetadata
               (ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *set,
               ConversionData *conv,Metadata *properties,string *prefix,uint nest)

{
  undefined8 uVar1;
  long *plVar2;
  IfcProperty *pIVar3;
  long *plVar4;
  long lVar5;
  mapped_type *pmVar6;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  size_type *psVar10;
  ulong uVar11;
  ulong uVar12;
  _func_int *p_Var13;
  Out *v;
  string value_1;
  string value;
  long *local_258;
  long local_250;
  long local_248 [2];
  undefined1 local_238 [32];
  ConversionData *local_218;
  ios_base *local_210;
  uint local_204;
  string *local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  double local_1d8;
  Metadata *local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  long *local_1b8 [2];
  long local_1a8 [14];
  ios_base aiStack_138 [264];
  
  uVar11 = (ulong)nest;
  local_1c0 = (set->
              super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
              ).
              super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = (set->
              super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
              ).
              super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c0 != local_1c8) {
    local_210 = aiStack_138;
    local_204 = (int)prefix + 1;
    local_218 = conv;
    local_200 = prefix;
    local_1d0 = properties;
    do {
      pIVar3 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProperty>(local_1c0->obj);
      lVar5 = *(long *)&(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
      if (lVar5 == 0) {
        lVar9 = *(long *)&(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                          field_0x10;
        local_238._0_8_ = local_238 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,lVar9,
                   *(long *)&(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>)
                             .field_0x18 + lVar9);
      }
      else {
        local_1f8[0] = local_1e8;
        lVar9 = *(long *)&(properties->_M_t)._M_impl;
        std::__cxx11::string::_M_construct<char*>((string *)local_1f8,lVar9,lVar9 + lVar5);
        std::__cxx11::string::append((char *)local_1f8);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_1f8,
                                    *(ulong *)&(pIVar3->
                                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>
                                               ).field_0x10);
        psVar10 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar10) {
          local_238._16_8_ = *psVar10;
          local_238._24_8_ = plVar4[3];
          local_238._0_8_ = local_238 + 0x10;
        }
        else {
          local_238._16_8_ = *psVar10;
          local_238._0_8_ = (size_type *)*plVar4;
        }
        local_238._8_8_ = plVar4[1];
        *plVar4 = (long)psVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
      }
      if ((lVar5 != 0) && (local_1f8[0] != local_1e8)) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      p_Var13 = (_func_int *)
                ((long)&(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                        _vptr_ObjectHelper +
                (long)(pIVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                      _vptr_ObjectHelper[-3]);
      lVar5 = __dynamic_cast(p_Var13,&Assimp::STEP::Object::typeinfo,
                             &Assimp::IFC::Schema_2x3::IfcPropertySingleValue::typeinfo,
                             0xffffffffffffffff);
      if (lVar5 == 0) {
        lVar5 = __dynamic_cast(p_Var13,&Assimp::STEP::Object::typeinfo,
                               &Assimp::IFC::Schema_2x3::IfcPropertyListValue::typeinfo,
                               0xffffffffffffffff);
        if (lVar5 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
          plVar4 = *(long **)(lVar5 + 0x78);
          plVar2 = *(long **)(lVar5 + 0x80);
          if (plVar4 != plVar2) {
            uVar12 = 0;
            do {
              lVar9 = *plVar4;
              if (lVar9 != 0) {
                lVar7 = __dynamic_cast(lVar9,&Assimp::STEP::EXPRESS::DataType::typeinfo,
                                       &Assimp::STEP::EXPRESS::
                                        PrimitiveDataType<std::__cxx11::string>::typeinfo,0);
                if (lVar7 == 0) {
                  lVar7 = __dynamic_cast(lVar9,&Assimp::STEP::EXPRESS::DataType::typeinfo,
                                         &Assimp::STEP::EXPRESS::PrimitiveDataType<double>::typeinfo
                                         ,0);
                  if (lVar7 == 0) {
                    lVar9 = __dynamic_cast(lVar9,&Assimp::STEP::EXPRESS::DataType::typeinfo,
                                           &Assimp::STEP::EXPRESS::PrimitiveDataType<long>::typeinfo
                                           ,0);
                    if (lVar9 != 0) {
                      std::ostream::_M_insert<long>((long)local_1a8);
                    }
                  }
                  else {
                    std::ostream::_M_insert<double>((double)(float)*(double *)(lVar7 + 8));
                  }
                }
                else {
                  local_258 = local_248;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_258,*(long *)(lVar7 + 8),
                             *(long *)(lVar7 + 0x10) + *(long *)(lVar7 + 8));
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,(char *)local_258,local_250);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
                  if (local_258 != local_248) {
                    operator_delete(local_258,local_248[0] + 1);
                  }
                }
                uVar12 = (ulong)((int)uVar12 + 1);
                if (uVar12 < (ulong)(*(long *)(lVar5 + 0x80) - *(long *)(lVar5 + 0x78) >> 4)) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
                }
              }
              plVar4 = plVar4 + 2;
            } while (plVar4 != plVar2);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
          properties = local_1d0;
          std::__cxx11::stringbuf::str();
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_218,(key_type *)local_238);
          goto LAB_004e7ab7;
        }
        lVar5 = __dynamic_cast(p_Var13,&Assimp::STEP::Object::typeinfo,
                               &Assimp::IFC::Schema_2x3::IfcComplexProperty::typeinfo,
                               0xffffffffffffffff);
        if (lVar5 == 0) {
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_218,(key_type *)local_238);
          uVar11 = 0;
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,0x6a9e70);
        }
        else if ((uint)local_200 < 3) {
          ProcessMetadata((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL>
                           *)(lVar5 + 0x88),local_218,(Metadata *)local_238,
                          (string *)(ulong)local_204,(uint)uVar11);
        }
        else {
          Assimp::LogFunctions<Assimp::IFCImporter>::LogError((char *)0x4e798f);
        }
      }
      else if (*(char *)(lVar5 + 0x88) == '\x01') {
        uVar1 = *(undefined8 *)(lVar5 + 0x78);
        lVar5 = __dynamic_cast(uVar1,&Assimp::STEP::EXPRESS::DataType::typeinfo,
                               &Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>::
                                typeinfo,0);
        if (lVar5 == 0) {
          lVar5 = __dynamic_cast(uVar1,&Assimp::STEP::EXPRESS::DataType::typeinfo,
                                 &Assimp::STEP::EXPRESS::PrimitiveDataType<double>::typeinfo,0);
          if (lVar5 == 0) {
            lVar5 = __dynamic_cast(uVar1,&Assimp::STEP::EXPRESS::DataType::typeinfo,
                                   &Assimp::STEP::EXPRESS::PrimitiveDataType<long>::typeinfo,0);
            if (lVar5 == 0) goto LAB_004e7afb;
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::ostream::_M_insert<long>((long)local_1a8);
            std::__cxx11::stringbuf::str();
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_218,(key_type *)local_238);
          }
          else {
            local_1d8 = *(double *)(lVar5 + 8);
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::ostream::_M_insert<double>((double)(float)local_1d8);
            std::__cxx11::stringbuf::str();
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_218,(key_type *)local_238);
          }
LAB_004e7ab7:
          std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_258);
          if (local_258 != local_248) {
            operator_delete(local_258,local_248[0] + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_210);
        }
        else {
          local_1b8[0] = local_1a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b8,*(long *)(lVar5 + 8),
                     *(long *)(lVar5 + 0x10) + *(long *)(lVar5 + 8));
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_218,(key_type *)local_238);
          std::__cxx11::string::_M_assign((string *)pmVar6);
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
        }
      }
LAB_004e7afb:
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
      }
      local_1c0 = local_1c0 + 1;
    } while (local_1c0 != local_1c8);
  }
  return;
}

Assistant:

void ProcessMetadata(const Schema_2x3::ListOf< Schema_2x3::Lazy< Schema_2x3::IfcProperty >, 1, 0 >& set, ConversionData& conv, Metadata& properties,
        const std::string& prefix = "",
        unsigned int nest = 0) {
    for(const Schema_2x3::IfcProperty& property : set) {
        const std::string& key = prefix.length() > 0 ? (prefix + "." + property.Name) : property.Name;
        if (const Schema_2x3::IfcPropertySingleValue* const singleValue = property.ToPtr<Schema_2x3::IfcPropertySingleValue>()) {
            if (singleValue->NominalValue) {
                if (const ::Assimp::STEP::EXPRESS::STRING* str = singleValue->NominalValue.Get()->ToPtr<::Assimp::STEP::EXPRESS::STRING>()) {
                    std::string value = static_cast<std::string>(*str);
                    properties[key]=value;
                }
                else if (const ::Assimp::STEP::EXPRESS::REAL* val = singleValue->NominalValue.Get()->ToPtr<::Assimp::STEP::EXPRESS::REAL>()) {
                    float value = static_cast<float>(*val);
                    std::stringstream s;
                    s << value;
                    properties[key]=s.str();
                }
                else if (const ::Assimp::STEP::EXPRESS::INTEGER* val = singleValue->NominalValue.Get()->ToPtr<::Assimp::STEP::EXPRESS::INTEGER>()) {
                    int64_t value = static_cast<int64_t>(*val);
                    std::stringstream s;
                    s << value;
                    properties[key]=s.str();
                }
            }
        }
        else if (const Schema_2x3::IfcPropertyListValue* const listValue = property.ToPtr<Schema_2x3::IfcPropertyListValue>()) {
            std::stringstream ss;
            ss << "[";
            unsigned index=0;
            for(const Schema_2x3::IfcValue::Out& v : listValue->ListValues) {
                if (!v) continue;
                if (const ::Assimp::STEP::EXPRESS::STRING* str = v->ToPtr<::Assimp::STEP::EXPRESS::STRING>()) {
                    std::string value = static_cast<std::string>(*str);
                    ss << "'" << value << "'";
                }
                else if (const ::Assimp::STEP::EXPRESS::REAL* val = v->ToPtr<::Assimp::STEP::EXPRESS::REAL>()) {
                    float value = static_cast<float>(*val);
                    ss << value;
                }
                else if (const ::Assimp::STEP::EXPRESS::INTEGER* val = v->ToPtr<::Assimp::STEP::EXPRESS::INTEGER>()) {
                    int64_t value = static_cast<int64_t>(*val);
                    ss << value;
                }
                if (index+1<listValue->ListValues.size()) {
                    ss << ",";
                }
                index++;
            }
            ss << "]";
            properties[key]=ss.str();
        }
        else if (const Schema_2x3::IfcComplexProperty* const complexProp = property.ToPtr<Schema_2x3::IfcComplexProperty>()) {
            if(nest > 2) { // mostly arbitrary limit to prevent stack overflow vulnerabilities
                IFCImporter::LogError("maximum nesting level for IfcComplexProperty reached, skipping this property.");
            }
            else {
                ProcessMetadata(complexProp->HasProperties, conv, properties, key, nest + 1);
            }
        }
        else {
            properties[key]="";
        }
    }
}